

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O1

void __thiscall RedBlackTree::fixDelete(RedBlackTree *this,Node **node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *parent;
  Node *local_40;
  Node *local_38;
  
  pNVar2 = *node;
  if (pNVar2 != (Node *)0x0) {
    if (pNVar2 == this->root) {
      this->root = (Node *)0x0;
    }
    else if (((pNVar2->color == 0) || ((pNVar2->left != (Node *)0x0 && (pNVar2->left->color == 0))))
            || ((pNVar2->right != (Node *)0x0 && (pNVar2->right->color == 0)))) {
      pNVar1 = pNVar2->left;
      if (pNVar1 == (Node *)0x0) {
        pNVar1 = pNVar2->right;
      }
      pNVar3 = pNVar2->parent;
      if (pNVar2 == pNVar3->left) {
        pNVar3->left = pNVar1;
      }
      else {
        pNVar3->right = pNVar1;
      }
      if (pNVar1 != (Node *)0x0) {
        pNVar1->parent = (*node)->parent;
        pNVar1->color = 1;
      }
      if (*node != (Node *)0x0) {
        operator_delete(*node,0x20);
        return;
      }
    }
    else {
      local_40 = (Node *)0x0;
      local_38 = (Node *)0x0;
      pNVar2->color = 2;
      pNVar1 = (Node *)0x0;
      if (pNVar2 != this->root) {
        if (pNVar2->color == 2) {
          do {
            pNVar3 = pNVar2->parent;
            pNVar1 = pNVar3->left;
            local_38 = pNVar3;
            if (pNVar2 == pNVar1) {
              pNVar1 = pNVar3->right;
              if ((pNVar1 == (Node *)0x0) || (pNVar1->color != 0)) {
                pNVar2 = pNVar1->left;
                if (((pNVar2 == (Node *)0x0) || (pNVar2->color == 1)) &&
                   ((pNVar1->right == (Node *)0x0 || (pNVar1->right->color == 1))))
                goto LAB_001062cc;
                local_40 = pNVar1;
                if ((pNVar1->right == (Node *)0x0) || (pNVar1->right->color == 1)) {
                  if (pNVar2 != (Node *)0x0) {
                    pNVar2->color = 1;
                  }
                  if (pNVar1 != (Node *)0x0) {
                    pNVar1->color = 0;
                  }
                  rotateRight(this,&local_40);
                  local_40 = pNVar3->right;
                }
                if (local_40 != (Node *)0x0) {
                  local_40->color = pNVar3->color;
                }
                if (pNVar3 != (Node *)0x0) {
                  pNVar3->color = 1;
                }
                if (local_40->right != (Node *)0x0) {
                  local_40->right->color = 1;
                }
                leftRotate(this,&local_38);
                pNVar1 = local_40;
                goto LAB_001063df;
              }
              if (pNVar1 != (Node *)0x0) {
                pNVar1->color = 1;
              }
              if (pNVar3 != (Node *)0x0) {
                pNVar3->color = 0;
              }
              leftRotate(this,&local_38);
              pNVar3 = pNVar2;
            }
            else if ((pNVar1 == (Node *)0x0) || (pNVar1->color != 0)) {
              pNVar2 = pNVar1->left;
              if (((pNVar2 != (Node *)0x0) && (pNVar2->color != 1)) ||
                 ((pNVar1->right != (Node *)0x0 && (pNVar1->right->color != 1)))) {
                local_40 = pNVar1;
                if ((pNVar2 == (Node *)0x0) || (pNVar2->color == 1)) {
                  if (pNVar1->right != (Node *)0x0) {
                    pNVar1->right->color = 1;
                  }
                  if (pNVar1 != (Node *)0x0) {
                    pNVar1->color = 0;
                  }
                  leftRotate(this,&local_40);
                  local_40 = pNVar3->left;
                }
                if (local_40 != (Node *)0x0) {
                  local_40->color = pNVar3->color;
                }
                if (pNVar3 != (Node *)0x0) {
                  pNVar3->color = 1;
                }
                if (local_40->left != (Node *)0x0) {
                  local_40->left->color = 1;
                }
                rotateRight(this,&local_38);
                pNVar1 = local_40;
                goto LAB_001063df;
              }
LAB_001062cc:
              if (pNVar1 != (Node *)0x0) {
                pNVar1->color = 0;
              }
              if (pNVar3 != (Node *)0x0) {
                if (pNVar3->color == 0) {
                  if (pNVar3 != (Node *)0x0) {
                    pNVar3->color = 1;
                  }
                }
                else if (pNVar3 != (Node *)0x0) {
                  pNVar3->color = 2;
                }
              }
            }
            else {
              if (pNVar1 != (Node *)0x0) {
                pNVar1->color = 1;
              }
              if (pNVar3 != (Node *)0x0) {
                pNVar3->color = 0;
              }
              rotateRight(this,&local_38);
              pNVar3 = pNVar2;
            }
            if (((pNVar3 == (Node *)0x0) || (pNVar3 == this->root)) ||
               (pNVar2 = pNVar3, pNVar3->color != 2)) goto LAB_001063df;
          } while( true );
        }
        pNVar1 = (Node *)0x0;
      }
LAB_001063df:
      local_40 = pNVar1;
      pNVar2 = (*node)->parent;
      (&pNVar2->left)[*node != pNVar2->left] = (Node *)0x0;
      if (*node != (Node *)0x0) {
        operator_delete(*node,0x20);
      }
      if (this->root != (Node *)0x0) {
        this->root->color = 1;
      }
    }
  }
  return;
}

Assistant:

void RedBlackTree::fixDelete(Node *&node) {
    if (node == nullptr) {
        return;
    }

    if (node == root) {
        root = nullptr;
        return;
    }
    if (getColor(node) == RED || getColor(node->left) == RED || getColor(node->right) == RED) {
        Node *child = node->left != nullptr ? node->left : node->right;

        if (node == node->parent->left) {
            node->parent->left = child;
            if (child != nullptr) {
                child->parent = node->parent;
            }
            setColor(child, BLACK);
            delete (node);
        } else {
            node->parent->right = child;
            if (child != nullptr) {
                child->parent = node->parent;
            }
            setColor(child, BLACK);
            delete (node);
        }
    } else {
        Node *sibling = nullptr;
        Node *parent = nullptr;
        Node *ptr = node;
        setColor(ptr, DOUBLE_BLACK);
        while (ptr != root && getColor(ptr) == DOUBLE_BLACK) {
            parent = ptr->parent;
            if (ptr == parent->left) {
                sibling = parent->right;
                if (getColor(sibling) == RED) {
                    setColor(sibling, BLACK);
                    setColor(parent, RED);
                    leftRotate(parent);
                } else {
                    if (getColor(sibling->left) == BLACK && getColor(sibling->right) == BLACK) {
                        setColor(sibling, RED);
                        if (getColor(parent) == RED) {
                            setColor(parent, BLACK);
                        } else {
                            setColor(parent, DOUBLE_BLACK);
                        }
                        ptr = parent;
                    } else {
                        if (getColor(sibling->right) == BLACK) {
                            setColor(sibling->left, BLACK);
                            setColor(sibling, RED);
                            rotateRight(sibling);
                            sibling = parent->right;
                        }
                        setColor(sibling, parent->color);
                        setColor(parent, BLACK);
                        setColor(sibling->right, BLACK);
                        leftRotate(parent);
                        break;
                    }
                }
            } else {
                sibling = parent->left;
                if (getColor(sibling) == RED) {
                    setColor(sibling, BLACK);
                    setColor(parent, RED);
                    rotateRight(parent);
                } else {
                    if (getColor(sibling->left) == BLACK && getColor(sibling->right) == BLACK) {
                        setColor(sibling, RED);
                        if (getColor(parent) == RED) {
                            setColor(parent, BLACK);
                        } else {
                            setColor(parent, DOUBLE_BLACK);
                        }
                        ptr = parent;
                    } else {
                        if (getColor(sibling->left) == BLACK) {
                            setColor(sibling->right, BLACK);
                            setColor(sibling, RED);
                            leftRotate(sibling);
                            sibling = parent->left;
                        }
                        setColor(sibling, parent->color);
                        setColor(parent, BLACK);
                        setColor(sibling->left, BLACK);
                        rotateRight(parent);
                        break;
                    }
                }
            }
        }
        if (node == node->parent->left) {
            node->parent->left = nullptr;
        } else {
            node->parent->right = nullptr;
        }
        delete (node);
        setColor(root, BLACK);
    }
}